

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_util.cpp
# Opt level: O3

void duckdb::ExtensionUtil::RegisterFunction(DatabaseInstance *db,ScalarFunction *function)

{
  vector<duckdb::ScalarFunction,_true> *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Manager_type p_Var4;
  long lVar5;
  bind_scalar_function_t *pp_Var6;
  bind_scalar_function_t *pp_Var7;
  byte bVar8;
  ScalarFunctionSet set;
  ScalarFunctionSet local_1e0;
  string local_1a8;
  ScalarFunctionSet local_188;
  ScalarFunction local_150;
  
  bVar8 = 0;
  pcVar3 = (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name._M_dataplus
           ._M_p;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,pcVar3,
             pcVar3 + (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                      _M_string_length);
  ScalarFunctionSet::ScalarFunctionSet(&local_1e0,&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_150,(SimpleFunction *)function);
  local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02433130;
  LogicalType::LogicalType
            (&local_150.super_BaseScalarFunction.return_type,
             &(function->super_BaseScalarFunction).return_type);
  local_150.super_BaseScalarFunction.stability = (function->super_BaseScalarFunction).stability;
  local_150.super_BaseScalarFunction.null_handling =
       (function->super_BaseScalarFunction).null_handling;
  local_150.super_BaseScalarFunction.errors = (function->super_BaseScalarFunction).errors;
  local_150.super_BaseScalarFunction.collation_handling =
       (function->super_BaseScalarFunction).collation_handling;
  local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02432a00;
  local_150.function.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_150.function.super__Function_base._M_functor._8_8_ = 0;
  local_150.function.super__Function_base._M_manager = (_Manager_type)0x0;
  local_150.function._M_invoker = (function->function)._M_invoker;
  p_Var4 = (function->function).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    local_150.function.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(function->function).super__Function_base._M_functor;
    local_150.function.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(function->function).super__Function_base._M_functor + 8);
    (function->function).super__Function_base._M_manager = (_Manager_type)0x0;
    (function->function)._M_invoker = (_Invoker_type)0x0;
    local_150.function.super__Function_base._M_manager = p_Var4;
  }
  pp_Var6 = &function->bind;
  pp_Var7 = &local_150.bind;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pp_Var7 = *pp_Var6;
    pp_Var6 = pp_Var6 + (ulong)bVar8 * -2 + 1;
    pp_Var7 = pp_Var7 + (ulong)bVar8 * -2 + 1;
  }
  local_150.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (function->function_info).internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_150.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (function->function_info).internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (function->function_info).internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (function->function_info).internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this = &local_1e0.super_FunctionSet<duckdb::ScalarFunction>.functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_150);
  local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02432a00;
  if (local_150.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_150.function.super__Function_base._M_manager)
              ((_Any_data *)&local_150.function,(_Any_data *)&local_150.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_150.super_BaseScalarFunction);
  paVar1 = &local_188.super_FunctionSet<duckdb::ScalarFunction>.name.field_2;
  paVar2 = &local_1e0.super_FunctionSet<duckdb::ScalarFunction>.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p == paVar2) {
    local_188.super_FunctionSet<duckdb::ScalarFunction>.name.field_2._8_8_ =
         local_1e0.super_FunctionSet<duckdb::ScalarFunction>.name.field_2._8_8_;
    local_188.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_188.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p =
         local_1e0.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p;
  }
  local_188.super_FunctionSet<duckdb::ScalarFunction>.name._M_string_length =
       local_1e0.super_FunctionSet<duckdb::ScalarFunction>.name._M_string_length;
  local_1e0.super_FunctionSet<duckdb::ScalarFunction>.name._M_string_length = 0;
  local_1e0.super_FunctionSet<duckdb::ScalarFunction>.name.field_2._M_local_buf[0] = '\0';
  local_188.super_FunctionSet<duckdb::ScalarFunction>.functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1e0.super_FunctionSet<duckdb::ScalarFunction>.functions.
       super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
       super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_188.super_FunctionSet<duckdb::ScalarFunction>.functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1e0.super_FunctionSet<duckdb::ScalarFunction>.functions.
       super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
       super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_188.super_FunctionSet<duckdb::ScalarFunction>.functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1e0.super_FunctionSet<duckdb::ScalarFunction>.functions.
       super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
       super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1e0.super_FunctionSet<duckdb::ScalarFunction>.functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0.super_FunctionSet<duckdb::ScalarFunction>.functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e0.super_FunctionSet<duckdb::ScalarFunction>.functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p = (pointer)paVar2;
  RegisterFunction(db,&local_188);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
            (&local_188.super_FunctionSet<duckdb::ScalarFunction>.functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_188.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p);
  }
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ExtensionUtil::RegisterFunction(DatabaseInstance &db, ScalarFunction function) {
	ScalarFunctionSet set(function.name);
	set.AddFunction(std::move(function));
	RegisterFunction(db, std::move(set));
}